

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.hpp
# Opt level: O1

string * __thiscall
wire::string::replace
          (string *__return_storage_ptr__,string *this,string *target,string *replacement)

{
  pointer pcVar1;
  ulong uVar2;
  string s;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  pcVar1 = (this->super_string)._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->super_string)._M_string_length);
  uVar2 = std::__cxx11::string::find((char *)&local_50,(ulong)(target->_M_dataplus)._M_p,0);
  if (uVar2 != 0xffffffffffffffff) {
    do {
      std::__cxx11::string::replace
                ((ulong)&local_50,uVar2,(char *)target->_M_string_length,
                 (ulong)(replacement->_M_dataplus)._M_p);
      uVar2 = std::__cxx11::string::find
                        ((char *)&local_50,(ulong)(target->_M_dataplus)._M_p,
                         uVar2 + replacement->_M_string_length);
    } while (uVar2 != 0xffffffffffffffff);
  }
  (__return_storage_ptr__->super_string)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_string).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_50,local_50 + local_48);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string replace( const std::string &target, const std::string &replacement ) const
        {
            size_t found = 0;
            std::string s = *this;

            while( ( found = s.find( target, found ) ) != string::npos )
            {
                s.replace( found, target.length(), replacement );
                found += replacement.length();
            }

            return s;
        }